

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_MultiGFab.H
# Opt level: O1

void __thiscall amrex::EB2::GFab::define(GFab *this,Box *vbx)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int i;
  int iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  BaseFab<unsigned_int> *this_00;
  int iVar11;
  int iVar12;
  int idim;
  int iVar13;
  int iVar14;
  Box bx;
  Box local_68;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  uVar8 = *(undefined8 *)(vbx->smallend).vect;
  uVar2 = *(undefined8 *)((vbx->smallend).vect + 2);
  uVar3 = *(undefined8 *)((vbx->bigend).vect + 2);
  *(undefined8 *)(this->m_validbox).bigend.vect = *(undefined8 *)(vbx->bigend).vect;
  *(undefined8 *)((this->m_validbox).bigend.vect + 2) = uVar3;
  *(undefined8 *)(this->m_validbox).smallend.vect = uVar8;
  *(undefined8 *)((this->m_validbox).smallend.vect + 2) = uVar2;
  local_48 = (vbx->smallend).vect[0] + -2;
  iStack_44 = (vbx->smallend).vect[1] + -2;
  iStack_40 = (vbx->smallend).vect[2] + -2;
  iStack_3c = (vbx->bigend).vect[0] + 2;
  uVar5 = (vbx->btype).itype;
  iVar4 = (vbx->bigend).vect[1] + 2;
  iVar7 = (vbx->bigend).vect[2] + 2;
  local_68.smallend.vect[1] = iStack_44;
  local_68.smallend.vect[0] = local_48;
  local_68.bigend.vect[0] = iStack_3c;
  local_68.smallend.vect[2] = iStack_40;
  local_68.bigend.vect[1] = iVar4;
  local_68.bigend.vect[2] = iVar7;
  lVar6 = 0;
  do {
    if ((uVar5 >> ((uint)lVar6 & 0x1f) & 1) == 0) {
      piVar1 = local_68.bigend.vect + lVar6;
      *piVar1 = *piVar1 + 1;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_68.btype.itype = 7;
  lVar6 = 0;
  BaseFab<double>::resize(&this->m_levelset,&local_68,1,(Arena *)0x0);
  iVar12 = (int)(uVar5 << 0x1e) >> 0x1f;
  iVar14 = (int)(uVar5 << 0x1d) >> 0x1f;
  iVar11 = iStack_44 - (uVar5 & 1);
  this_00 = (this->m_edgetype)._M_elems;
  do {
    iVar13 = (int)lVar6;
    if (iVar13 == 1) {
      uVar5 = 2;
      iVar9 = 0;
      uVar8 = 0x100000000;
    }
    else if (iVar13 == 0) {
      uVar8 = 1;
      iVar9 = 0;
      uVar5 = 0;
    }
    else {
      uVar5 = 4;
      iVar9 = 1;
      uVar8 = 0;
    }
    local_68.smallend.vect[1] = iStack_44;
    local_68.smallend.vect[0] = local_48;
    local_68.bigend.vect[0] = (uint)uVar8 + iVar11;
    local_68.smallend.vect[2] = iStack_40;
    local_68.bigend.vect[1] = (int)((ulong)uVar8 >> 0x20) + iVar12 + iVar4;
    local_68.bigend.vect[2] = iVar9 + iVar14 + iVar7;
    local_68.btype.itype = uVar5 | (uint)uVar8;
    iVar9 = 1;
    BaseFab<unsigned_int>::resize(this_00 + -3,&local_68,1,(Arena *)0x0);
    uVar10 = 4;
    uVar5 = 2;
    if (iVar13 == 0) {
      uVar8 = 0x100000000;
    }
    else if (iVar13 == 1) {
      uVar8 = 1;
      uVar5 = 0;
    }
    else {
      uVar8 = 0x100000001;
      uVar10 = 0;
      iVar9 = 0;
    }
    local_68.smallend.vect[1] = iStack_44;
    local_68.smallend.vect[0] = local_48;
    local_68.bigend.vect[0] = (uint)uVar8 + iVar11;
    local_68.smallend.vect[2] = iStack_40;
    local_68.bigend.vect[1] = (int)((ulong)uVar8 >> 0x20) + iVar12 + iVar4;
    local_68.bigend.vect[2] = iVar9 + iVar14 + iVar7;
    local_68.btype.itype = uVar5 | uVar10 | (uint)uVar8;
    BaseFab<unsigned_int>::resize(this_00,&local_68,1,(Arena *)0x0);
    lVar6 = lVar6 + 1;
    this_00 = this_00 + 1;
  } while (lVar6 != 3);
  return;
}

Assistant:

void define(const Box& vbx) {
        m_validbox = vbx;
        const Box& bxg2 = amrex::grow(vbx,ng);
        m_levelset.resize(amrex::surroundingNodes(bxg2));
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            m_facetype[idim].resize(amrex::convert(bxg2,IntVect::TheDimensionVector(idim)));
#if (AMREX_SPACEDIM == 3)
            m_edgetype[idim].resize(amrex::convert(bxg2,IntVect::TheNodeVector()
                                                       -IntVect::TheDimensionVector(idim)));
#endif
        }
    }